

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::sendSignal(Thread *this,int signo)

{
  Fault local_20;
  Fault f;
  int pthreadResult;
  int signo_local;
  Thread *this_local;
  
  f.exception._4_4_ = signo;
  f.exception._0_4_ = pthread_kill(this->threadId,signo);
  if ((int)f.exception != 0) {
    _::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++"
               ,0x62,(int)f.exception,"pthread_kill","");
    _::Debug::Fault::~Fault(&local_20);
  }
  return;
}

Assistant:

void Thread::sendSignal(int signo) {
  int pthreadResult = pthread_kill(*reinterpret_cast<pthread_t*>(&threadId), signo);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_kill", pthreadResult) { break; }
  }
}